

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O3

type _q_interpolate<QSize>(QSize *f,QSize *t,qreal progress)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  type tVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = (f->wd).m_i;
  iVar2 = (f->ht).m_i;
  dVar6 = (double)((t->wd).m_i - iVar1) * progress;
  dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
  bVar3 = 2147483647.0 < dVar6;
  if (dVar6 <= -2147483648.0) {
    dVar6 = -2147483648.0;
  }
  dVar7 = (double)((t->ht).m_i - iVar2) * progress;
  dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  bVar4 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  tVar5.wd.m_i = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar6) +
                 iVar1;
  tVar5.ht.m_i = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar7) +
                 iVar2;
  return tVar5;
}

Assistant:

friend inline constexpr QSize operator*(const QSize &s, qreal c) noexcept
    { return QSize(QtPrivate::qSaturateRound(s.width() * c), QtPrivate::qSaturateRound(s.height() * c)); }